

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O1

idx_t duckdb::GetEffectiveOffset
                (ArrowArray *array,int64_t parent_offset,ArrowScanLocalState *state,
                int64_t nested_offset)

{
  idx_t iVar1;
  
  iVar1 = array->offset + parent_offset + state->chunk_offset;
  if (nested_offset != -1) {
    iVar1 = array->offset + nested_offset;
  }
  return iVar1;
}

Assistant:

idx_t GetEffectiveOffset(const ArrowArray &array, int64_t parent_offset, const ArrowScanLocalState &state,
                         int64_t nested_offset = -1) {
	if (nested_offset != -1) {
		// The parent of this array is a list
		// We just ignore the parent offset, it's already applied to the list
		return UnsafeNumericCast<idx_t>(array.offset + nested_offset);
	}
	// Parent offset is set in the case of a struct, it applies to all child arrays
	// 'chunk_offset' is how much of the chunk we've already scanned, in case the chunk size exceeds
	// STANDARD_VECTOR_SIZE
	return UnsafeNumericCast<idx_t>(array.offset + parent_offset) + state.chunk_offset;
}